

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VdbeExplainPop(Parse *pParse)

{
  Vdbe *pVVar1;
  int iVar2;
  Op *pOVar3;
  
  iVar2 = pParse->addrExplain;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    pVVar1 = pParse->pVdbe;
    if (iVar2 < 0) {
      iVar2 = pVVar1->nOp + -1;
    }
    if (pVVar1->db->mallocFailed == '\0') {
      pOVar3 = pVVar1->aOp + iVar2;
    }
    else {
      pOVar3 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    iVar2 = pOVar3->p2;
  }
  pParse->addrExplain = iVar2;
  return;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeExplainParent(Parse *pParse){
  VdbeOp *pOp;
  if( pParse->addrExplain==0 ) return 0;
  pOp = sqlite3VdbeGetOp(pParse->pVdbe, pParse->addrExplain);
  return pOp->p2;
}